

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O1

IDenseNetwork * __thiscall
IDenseNetworkBuilder::Build
          (IDenseNetworkBuilder *this,vector<LayerMeta,_std::allocator<LayerMeta>_> *layersMeta,
          ISynapseBuilder *synapseBuilder,ILayerBuilder *layerBuilder,IEventManager *eventManager,
          default_random_engine *generator,float induceDistLimit)

{
  ulong uVar1;
  size_t *psVar2;
  pointer pcVar3;
  ISynapseBuilder *pIVar4;
  default_random_engine *pdVar5;
  undefined8 uVar6;
  size_t sVar7;
  IDenseNetwork *this_00;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  pointer pLVar11;
  float fVar12;
  pair<unsigned_long,_unsigned_long> pVar13;
  vector<ILayer_*,_std::allocator<ILayer_*>_> layers;
  float local_cc;
  vector<ILayer_*,_std::allocator<ILayer_*>_> local_c8;
  float local_a4;
  IEventManager *local_a0;
  ISynapseBuilder *local_98;
  default_random_engine *local_90;
  vector<ILayer_*,_std::allocator<ILayer_*>_> local_88;
  float local_70 [2];
  long *local_68 [2];
  long local_58 [2];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a4 = induceDistLimit;
  local_a0 = eventManager;
  local_98 = synapseBuilder;
  local_90 = generator;
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::resize
            (&local_c8,
             (long)(layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 6);
  pLVar11 = (layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>)._M_impl.
      super__Vector_impl_data._M_finish != pLVar11) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      local_70[0] = (&pLVar11->alpha)[lVar10 * 2];
      local_68[0] = local_58;
      pcVar3 = (&(pLVar11->name)._M_dataplus)[lVar10]._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar3,pcVar3 + (&(pLVar11->name)._M_string_length)[lVar10]);
      local_38 = *(undefined8 *)(&pLVar11->width + lVar10 * 2);
      psVar2 = &pLVar11->size + lVar10;
      local_48 = (undefined4)*psVar2;
      uStack_44 = *(undefined4 *)((long)psVar2 + 4);
      uStack_40 = *(undefined4 *)(psVar2 + 1);
      uStack_3c = *(undefined4 *)((long)psVar2 + 0xc);
      uVar6 = (*(code *)**(undefined8 **)layerBuilder)(layerBuilder,local_70);
      *(undefined8 *)
       ((long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
              super__Vector_impl_data._M_start + lVar10) = uVar6;
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      uVar9 = uVar9 + 1;
      pLVar11 = (layersMeta->super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 8;
    } while (uVar9 < (ulong)((long)(layersMeta->
                                   super__Vector_base<LayerMeta,_std::allocator<LayerMeta>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pLVar11 >> 6));
  }
  pdVar5 = local_90;
  pIVar4 = local_98;
  if ((long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar8 = (long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_cc = 0.0;
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      if (uVar1 < uVar8) {
        sVar7 = ILayer::GetSize(local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar9 + 1]);
      }
      else {
        sVar7 = 0;
      }
      fVar12 = ILayer::GetZShift(local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]);
      local_cc = local_cc + fVar12;
      (*local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9]->_vptr_ILayer[2])
                (local_cc,local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar9],sVar7,pdVar5);
      if (sVar7 != 0) {
        (*local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9]->_vptr_ILayer[0xb])
                  (local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9],
                   local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9 + 1],pIVar4);
      }
      uVar8 = (long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar9 = uVar1;
    } while (uVar1 < uVar8);
  }
  pVar13 = BuildSpatialConnections(&local_c8,local_a4 * local_a4);
  this_00 = (IDenseNetwork *)operator_new(0x30);
  std::vector<ILayer_*,_std::allocator<ILayer_*>_>::vector(&local_88,&local_c8);
  IDenseNetwork::IDenseNetwork(this_00,&local_88,local_a0,pVar13.first,pVar13.second);
  if (local_88.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

IDenseNetwork *
IDenseNetworkBuilder::Build( const std::vector<LayerMeta> &layersMeta, const ISynapseBuilder &synapseBuilder,
                             const ILayerBuilder &layerBuilder, IEventManager &eventManager,
                             std::default_random_engine &generator, float induceDistLimit ) const
{
    float squaredDistLimit = induceDistLimit * induceDistLimit;
    std::vector<ILayer *> layers;
    layers.resize( layersMeta.size());
    for ( int ldx = 0; ldx < layersMeta.size(); ++ldx ) {
        layers[ldx] = layerBuilder.Build( layersMeta[ldx] );
    }
    float zShift = 0;

    for ( size_t ldx = 0; ldx < layers.size(); ++ldx ) {
        size_t nextLayerSize = ldx + 1 < layers.size() ? layers[ldx + 1]->GetSize() : 0;
        zShift += layers[ldx]->GetZShift();
        layers[ldx]->Init( nextLayerSize, generator, zShift );
        if ( nextLayerSize ) {
            layers[ldx]->BindWithNext( *layers[ldx + 1], synapseBuilder );
        }
    }
    auto sConnectionsInfo = BuildSpatialConnections( layers, squaredDistLimit );
    return new IDenseNetwork( layers, eventManager, sConnectionsInfo.first, sConnectionsInfo.second );
}